

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int decodeFlags(MemPage *pPage,int flagByte)

{
  long lVar1;
  int iVar2;
  uint in_ESI;
  long in_RDI;
  BtShared *pBt;
  
  *(char *)(in_RDI + 5) = (char)((int)in_ESI >> 3);
  *(char *)(in_RDI + 7) = *(char *)(in_RDI + 5) * -4 + '\x04';
  lVar1 = *(long *)(in_RDI + 0x48);
  if ((in_ESI & 0xfffffff7) == 5) {
    *(undefined1 *)(in_RDI + 2) = 1;
    *(undefined1 *)(in_RDI + 3) = *(undefined1 *)(in_RDI + 5);
    *(byte *)(in_RDI + 4) = (*(char *)(in_RDI + 5) != '\0' ^ 0xffU) & 1;
    *(undefined2 *)(in_RDI + 10) = *(undefined2 *)(lVar1 + 0x2c);
    *(undefined2 *)(in_RDI + 0xc) = *(undefined2 *)(lVar1 + 0x2e);
  }
  else {
    if ((in_ESI & 0xfffffff7) != 2) {
      iVar2 = sqlite3CorruptError(0);
      return iVar2;
    }
    *(undefined1 *)(in_RDI + 2) = 0;
    *(undefined1 *)(in_RDI + 3) = 0;
    *(undefined1 *)(in_RDI + 4) = 0;
    *(undefined2 *)(in_RDI + 10) = *(undefined2 *)(lVar1 + 0x28);
    *(undefined2 *)(in_RDI + 0xc) = *(undefined2 *)(lVar1 + 0x2a);
  }
  *(undefined1 *)(in_RDI + 8) = *(undefined1 *)(lVar1 + 0x25);
  return 0;
}

Assistant:

static int decodeFlags(MemPage *pPage, int flagByte){
  BtShared *pBt;     /* A copy of pPage->pBt */

  assert( pPage->hdrOffset==(pPage->pgno==1 ? 100 : 0) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  pPage->leaf = (u8)(flagByte>>3);  assert( PTF_LEAF == 1<<3 );
  flagByte &= ~PTF_LEAF;
  pPage->childPtrSize = 4-4*pPage->leaf;
  pBt = pPage->pBt;
  if( flagByte==(PTF_LEAFDATA | PTF_INTKEY) ){
    /* EVIDENCE-OF: R-03640-13415 A value of 5 means the page is an interior
    ** table b-tree page. */
    assert( (PTF_LEAFDATA|PTF_INTKEY)==5 );
    /* EVIDENCE-OF: R-20501-61796 A value of 13 means the page is a leaf
    ** table b-tree page. */
    assert( (PTF_LEAFDATA|PTF_INTKEY|PTF_LEAF)==13 );
    pPage->intKey = 1;
    pPage->intKeyLeaf = pPage->leaf;
    pPage->noPayload = !pPage->leaf;
    pPage->maxLocal = pBt->maxLeaf;
    pPage->minLocal = pBt->minLeaf;
  }else if( flagByte==PTF_ZERODATA ){
    /* EVIDENCE-OF: R-27225-53936 A value of 2 means the page is an interior
    ** index b-tree page. */
    assert( (PTF_ZERODATA)==2 );
    /* EVIDENCE-OF: R-16571-11615 A value of 10 means the page is a leaf
    ** index b-tree page. */
    assert( (PTF_ZERODATA|PTF_LEAF)==10 );
    pPage->intKey = 0;
    pPage->intKeyLeaf = 0;
    pPage->noPayload = 0;
    pPage->maxLocal = pBt->maxLocal;
    pPage->minLocal = pBt->minLocal;
  }else{
    /* EVIDENCE-OF: R-47608-56469 Any other value for the b-tree page type is
    ** an error. */
    return SQLITE_CORRUPT_BKPT;
  }
  pPage->max1bytePayload = pBt->max1bytePayload;
  return SQLITE_OK;
}